

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fStencilTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::StencilCase::visualizeStencil
          (StencilCase *this,Context *context,int stencilBits,int stencilStep)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  Vec4 color;
  Vec3 local_50;
  Vec3 local_40;
  
  iVar1 = 1 << ((byte)stencilBits & 0x1f);
  uVar5 = iVar1 / stencilStep + 1;
  (*context->_vptr_Context[0x33])(context,0xb90,(long)iVar1 % (long)stencilStep & 0xffffffff);
  (*context->_vptr_Context[0x36])(context,0x1e00,0x1e00,0x1e00);
  uVar2 = iVar1 - 1;
  uVar3 = 1;
  if (1 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar6 = 0;
  if ((int)uVar5 < 1) {
    uVar5 = uVar6;
  }
  while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
    uVar4 = uVar2;
    if ((int)uVar6 < (int)uVar2) {
      uVar4 = uVar6;
    }
    color.m_data[2] = (float)(int)uVar4 / (float)(int)uVar3;
    color.m_data[1] = 1.0 - color.m_data[2];
    color.m_data[0] = 0.0;
    color.m_data[3] = 1.0;
    StencilShader::setColor(&this->m_shader,context,this->m_shaderID,&color);
    (*context->_vptr_Context[0x35])(context,0x202,(ulong)uVar4,0xffffffffffffffff);
    local_40.m_data[0] = -1.0;
    local_40.m_data[1] = -1.0;
    local_40.m_data[2] = 0.0;
    local_50.m_data[0] = 1.0;
    local_50.m_data[1] = 1.0;
    local_50.m_data[2] = 0.0;
    sglr::drawQuad(context,this->m_shaderID,&local_40,&local_50);
    uVar6 = uVar6 + stencilStep;
  }
  return;
}

Assistant:

void StencilCase::visualizeStencil (sglr::Context& context, int stencilBits, int stencilStep)
{
	int endVal				= 1<<stencilBits;
	int numStencilValues	= endVal/stencilStep + 1;

	context.enable(GL_STENCIL_TEST);
	context.stencilOp(GL_KEEP, GL_KEEP, GL_KEEP);

	for (int ndx = 0; ndx < numStencilValues; ndx++)
	{
		int			value		= deMin32(ndx*stencilStep, endVal-1);
		float		colorMix	= (float)value/(float)de::max(1, endVal-1);
		tcu::Vec4	color		(0.0f, 1.0f-colorMix, colorMix, 1.0f);

		m_shader.setColor(context, m_shaderID, color);
		context.stencilFunc(GL_EQUAL, value, 0xffffffffu);
		sglr::drawQuad(context, m_shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));
	}
}